

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_TextObject::GetBBox
          (ON_OBSOLETE_V5_TextObject *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  bool bVar1;
  int iVar2;
  ON_2dPoint *pOVar3;
  ON_3dPoint local_80;
  double local_68;
  ON_2dPoint uv;
  ON_BoundingBox bbox;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_OBSOLETE_V5_TextObject *this_local;
  
  ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&uv.y);
  bbox.m_max.z._7_1_ = bGrowBox;
  if (bGrowBox) {
    uv.y = *boxmin;
    bbox.m_min.x = boxmin[1];
    bbox.m_min.y = boxmin[2];
    bbox.m_min.z = *boxmax;
    bbox.m_max.x = boxmax[1];
    bbox.m_max.y = boxmax[2];
    bVar1 = ON_BoundingBox::IsValid((ON_BoundingBox *)&uv.y);
    if (!bVar1) {
      ON_BoundingBox::Destroy((ON_BoundingBox *)&uv.y);
      bbox.m_max.z._7_1_ = 0;
    }
  }
  iVar2 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  if (iVar2 == 1) {
    pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,0);
    local_68 = pOVar3->x;
    uv.x = pOVar3->y;
    ON_Plane::PointAt(&local_80,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,local_68,uv.x);
    ON_BoundingBox::Set((ON_BoundingBox *)&uv.y,&local_80,(uint)(bbox.m_max.z._7_1_ & 1));
    bbox.m_max.z._7_1_ = 1;
  }
  else {
    iVar2 = ON_SimpleArray<ON_2dPoint>::Count
                      (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                        super_ON_SimpleArray<ON_2dPoint>);
    if (iVar2 == 0) {
      ON_BoundingBox::Set((ON_BoundingBox *)&uv.y,
                          &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin,
                          (uint)(bbox.m_max.z._7_1_ & 1));
      bbox.m_max.z._7_1_ = 1;
    }
  }
  if ((bbox.m_max.z._7_1_ & 1) != 0) {
    *boxmin = uv.y;
    boxmin[1] = bbox.m_min.x;
    boxmin[2] = bbox.m_min.y;
    *boxmax = bbox.m_min.z;
    boxmax[1] = bbox.m_max.x;
    boxmax[2] = bbox.m_max.y;
  }
  return (bool)(bbox.m_max.z._7_1_ & 1);
}

Assistant:

bool ON_OBSOLETE_V5_TextObject::GetBBox(
        double* boxmin,
        double* boxmax,
        bool bGrowBox
        ) const
{
  ON_BoundingBox bbox;
  if ( bGrowBox )
  {
    bbox.m_min.x = boxmin[0]; 
    bbox.m_min.y = boxmin[1]; 
    bbox.m_min.z = boxmin[2];
    bbox.m_max.x = boxmax[0]; 
    bbox.m_max.y = boxmax[1]; 
    bbox.m_max.z = boxmax[2];
    if ( !bbox.IsValid() )
    {
      bbox.Destroy();
      bGrowBox = false;
    }
  }

  if ( 1 == m_points.Count() )
  {
    ON_2dPoint uv = m_points[0];
    bbox.Set( m_plane.PointAt(uv.x,uv.y), bGrowBox );
    bGrowBox = true;
  }
  else if ( 0 == m_points.Count() )
  {
    bbox.Set( m_plane.origin, bGrowBox );
    bGrowBox = true;
  }

  if ( bGrowBox )
  {
    boxmin[0] = bbox.m_min.x; 
    boxmin[1] = bbox.m_min.y; 
    boxmin[2] = bbox.m_min.z; 
    boxmax[0] = bbox.m_max.x; 
    boxmax[1] = bbox.m_max.y; 
    boxmax[2] = bbox.m_max.z; 
  }

  return bGrowBox;
}